

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_new2(archive *a)

{
  archive *in_RDI;
  archive_entry *entry;
  archive_entry *local_8;
  
  local_8 = (archive_entry *)malloc(0x438);
  if (local_8 == (archive_entry *)0x0) {
    local_8 = (archive_entry *)0x0;
  }
  else {
    memset(local_8,0,0x438);
    local_8->archive = in_RDI;
  }
  return local_8;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)malloc(sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	memset(entry, 0, sizeof(*entry));
	entry->archive = a;
	return (entry);
}